

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_meshlink.c
# Opt level: O3

REF_STATUS ref_meshlink_close(REF_GRID ref_grid)

{
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_meshlink_close(REF_GRID ref_grid) {
#ifdef HAVE_MESHLINK
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  ProjectionDataObj projection_data = NULL;
  if (NULL != ref_geom->meshlink_projection) {
    projection_data = (ProjectionDataObj)(ref_geom->meshlink_projection);
    ML_freeProjectionDataObj(&projection_data);
  }
#else
  SUPRESS_UNUSED_COMPILER_WARNING(ref_grid);
#endif
  return REF_SUCCESS;
}